

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_unitStandardUnitsWhichAreBaseUnits_Test::Validator_unitStandardUnitsWhichAreBaseUnits_Test
          (Validator_unitStandardUnitsWhichAreBaseUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0015f6b8;
  return;
}

Assistant:

TEST(Validator, unitStandardUnitsWhichAreBaseUnits)
{
    const std::vector<std::string> expectedIssues = {
        "Variable 'v1' in component 'c1' has units of 'metre' and an equivalent variable 'v2' in component 'c2' with non-matching units of 'second'. The mismatch is: metre^1, second^-1.",
    };

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr m = createModelTwoComponentsWithOneVariableEach("m", "c1", "c2", "v1", "v2");
    auto c1 = m->component(0);
    auto c2 = m->component(1);
    auto v1 = c1->variable(0);
    auto v2 = c2->variable(0);

    v1->setUnits("metre");
    v2->setUnits("second");

    libcellml::Variable::addEquivalence(v1, v2); // metre != second.

    validator->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, validator);
}